

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O3

void __thiscall CRegexParser::concat_onto(CRegexParser *this,re_machine *dest,re_machine *rhs)

{
  re_machine in_RAX;
  re_machine new_machine;
  re_machine local_18;
  
  if (dest->init == -1) {
    local_18 = *rhs;
  }
  else {
    local_18 = in_RAX;
    build_concat(this,&local_18,dest,rhs);
  }
  *dest = local_18;
  return;
}

Assistant:

void CRegexParser::concat_onto(re_machine *dest, re_machine *rhs)
{
    /* check for a null destination machine */
    if (is_machine_null(dest))
    {
        /* 
         *   the first machine is null - simply copy the second machine
         *   onto the first unchanged 
         */
        *dest = *rhs;
    }
    else
    {
        re_machine new_machine;
        
        /* build the concatenated machine */
        build_concat(&new_machine, dest, rhs);

        /* copy the concatenated machine onto the first machine */
        *dest = new_machine;
    }
}